

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::AddVectorToAllColumns::forward_impl
          (AddVectorToAllColumns *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> b;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> y;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Replicate<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>,_1,__1>_>_>
  *in_stack_fffffffffffffe88;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffe90;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe98;
  Tensor *in_stack_fffffffffffffeb8;
  DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
  *in_stack_ffffffffffffff00;
  VectorwiseOp<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
  *in_stack_ffffffffffffff08;
  
  Tensor::operator*(in_stack_fffffffffffffeb8);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::operator*(in_stack_fffffffffffffeb8);
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
  Tensor::operator*(in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  colwise(in_stack_fffffffffffffe98);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  col(in_stack_fffffffffffffe98,(Index)in_stack_fffffffffffffe90);
  Eigen::VectorwiseOp<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,0>::
  operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  return;
}

Assistant:

void AddVectorToAllColumns::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
    throw std::runtime_error("AddVectorToAllColumns::forward not implemented for CUDA");
#else
  auto y = *fx;
  auto x = **xs[0];
  auto b = **xs[1];
  y = x.colwise() + b.col(0);
#endif
}